

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

void Gia_WinCreateFromCut(Gia_Man_t *p,Vec_Int_t *vIn,Vec_Wec_t *vLevels,Vec_Int_t *vWin)

{
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  Vec_Int_t *pVVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pGVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  piVar11 = (int *)malloc(400);
  p_00->pArray = piVar11;
  if (0 < (long)vLevels->nSize) {
    lVar16 = 0;
    iVar18 = 0;
    do {
      iVar18 = iVar18 + *(int *)((long)&vLevels->pArray->nSize + lVar16);
      lVar16 = lVar16 + 0x10;
    } while ((long)vLevels->nSize * 0x10 != lVar16);
    if (iVar18 != 0) {
      __assert_fail("Vec_WecSizeSize(vLevels) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                    ,0x3de,
                    "void Gia_WinCreateFromCut(Gia_Man_t *, Vec_Int_t *, Vec_Wec_t *, Vec_Int_t *)")
      ;
    }
  }
  vWin->nSize = 0;
  Gia_ManIncrementTravId(p);
  if (0 < vIn->nSize) {
    lVar16 = 0;
    do {
      iVar18 = vIn->pArray[lVar16];
      if (p->nTravIdsAlloc <= iVar18) {
        __assert_fail("Id < p->nTravIdsAlloc",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x266,"void Gia_ObjSetTravIdCurrentId(Gia_Man_t *, int)");
      }
      p->pTravIds[iVar18] = p->nTravIds;
      uVar9 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar18);
      iVar10 = vLevels->nSize;
      if (iVar10 <= (int)uVar9) {
        iVar6 = uVar9 + 1;
        iVar7 = iVar10 * 2;
        if (iVar10 * 2 <= iVar6) {
          iVar7 = iVar6;
        }
        iVar10 = vLevels->nCap;
        if (iVar10 < iVar7) {
          if (vLevels->pArray == (Vec_Int_t *)0x0) {
            pVVar12 = (Vec_Int_t *)malloc((long)iVar7 << 4);
          }
          else {
            pVVar12 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar7 << 4);
            iVar10 = vLevels->nCap;
          }
          vLevels->pArray = pVVar12;
          memset(pVVar12 + iVar10,0,(long)(iVar7 - iVar10) << 4);
          vLevels->nCap = iVar7;
        }
        vLevels->nSize = iVar6;
        iVar10 = iVar6;
      }
      if (((int)uVar9 < 0) || (iVar10 <= (int)uVar9)) goto LAB_007b1417;
      Vec_IntPush(vLevels->pArray + uVar9,iVar18);
      Vec_IntPush(vWin,iVar18);
      iVar18 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar18);
      Vec_IntPushUniqueOrder(p_00,iVar18);
      lVar16 = lVar16 + 1;
    } while (lVar16 < vIn->nSize);
    iVar18 = p_00->nSize;
    if (0 < iVar18) {
      lVar16 = 0;
LAB_007b0f5f:
      lVar15 = (long)p_00->pArray[lVar16];
      if ((lVar15 < 0) || (vLevels->nSize <= p_00->pArray[lVar16])) {
LAB_007b1417:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pVVar12 = vLevels->pArray;
      if (0 < pVVar12[lVar15].nSize) {
        lVar17 = 0;
LAB_007b0fa9:
        iVar18 = pVVar12[lVar15].pArray[lVar17];
        if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) {
LAB_007b13d9:
          __assert_fail("v >= 0 && v < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                        ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
        }
        pGVar14 = p->pObjs;
        if (pGVar14 != (Gia_Obj_t *)0x0) {
          pGVar1 = pGVar14 + iVar18;
          iVar18 = 0;
          do {
            pGVar2 = pGVar14 + p->nObjs;
            if (pGVar2 <= pGVar1) goto LAB_007b13ba;
            uVar9 = (int)((long)pGVar1 - (long)pGVar14 >> 2) * -0x55555555;
            if (((int)uVar9 < 0) || (p->vFanoutNums->nSize <= (int)uVar9)) {
LAB_007b139b:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (p->vFanoutNums->pArray[uVar9 & 0x7fffffff] <= iVar18) goto LAB_007b1317;
            uVar5 = p->vFanout->nSize;
            if ((int)uVar5 <= (int)uVar9) goto LAB_007b139b;
            piVar11 = p->vFanout->pArray;
            uVar9 = piVar11[uVar9 & 0x7fffffff] + iVar18;
            if (((int)uVar9 < 0) || (uVar5 <= uVar9)) goto LAB_007b139b;
            iVar10 = piVar11[uVar9];
            lVar19 = (long)iVar10;
            if ((lVar19 < 0) || (p->nObjs <= iVar10)) goto LAB_007b13d9;
            iVar18 = iVar18 + 1;
            if (iVar18 == 6) goto LAB_007b1317;
            pGVar3 = pGVar14 + lVar19;
            uVar8 = *(ulong *)pGVar3;
            if ((uVar8 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar8) {
              iVar6 = p->nTravIdsAlloc;
              if (iVar6 <= iVar10) {
LAB_007b13f8:
                __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                              ,0x264,"int Gia_ObjIsTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
              }
              piVar11 = p->pTravIds;
              iVar7 = p->nTravIds;
              if (piVar11[lVar19] != iVar7) {
                pGVar4 = pGVar3 + -(uVar8 & 0x1fffffff);
                if ((pGVar4 < pGVar14) || (pGVar2 <= pGVar4)) goto LAB_007b13ba;
                iVar20 = (int)((long)pGVar4 - (long)pGVar14 >> 2) * -0x55555555;
                if (iVar6 <= iVar20) goto LAB_007b13f8;
                if (piVar11[iVar20] == iVar7) {
                  pGVar4 = pGVar3 + -(ulong)((uint)(uVar8 >> 0x20) & 0x1fffffff);
                  if ((pGVar4 < pGVar14) || (pGVar2 <= pGVar4)) goto LAB_007b13ba;
                  iVar20 = (int)((long)pGVar4 - (long)pGVar14 >> 2) * -0x55555555;
                  if (iVar6 <= iVar20) goto LAB_007b13f8;
                  if (piVar11[iVar20] == iVar7) {
                    piVar11[lVar19] = iVar7;
                    if (p->nObjs <= iVar10) goto LAB_007b13ba;
                    uVar9 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar10);
                    pGVar14 = p->pObjs;
                    if ((pGVar3 < pGVar14) || (pGVar14 + p->nObjs <= pGVar3)) goto LAB_007b13ba;
                    iVar10 = vLevels->nSize;
                    if (iVar10 <= (int)uVar9) {
                      iVar6 = uVar9 + 1;
                      iVar7 = iVar10 * 2;
                      if (iVar10 * 2 <= iVar6) {
                        iVar7 = iVar6;
                      }
                      iVar10 = vLevels->nCap;
                      if (iVar10 < iVar7) {
                        if (vLevels->pArray == (Vec_Int_t *)0x0) {
                          pVVar13 = (Vec_Int_t *)malloc((long)iVar7 << 4);
                        }
                        else {
                          pVVar13 = (Vec_Int_t *)realloc(vLevels->pArray,(long)iVar7 << 4);
                          iVar10 = vLevels->nCap;
                        }
                        vLevels->pArray = pVVar13;
                        memset(pVVar13 + iVar10,0,(long)(iVar7 - iVar10) << 4);
                        vLevels->nCap = iVar7;
                      }
                      vLevels->nSize = iVar6;
                      iVar10 = iVar6;
                    }
                    if (((int)uVar9 < 0) || (iVar10 <= (int)uVar9)) goto LAB_007b1417;
                    Vec_IntPush(vLevels->pArray + uVar9,
                                (int)((ulong)((long)pGVar3 - (long)pGVar14) >> 2) * -0x55555555);
                    pGVar14 = p->pObjs;
                    if ((pGVar3 < pGVar14) || (pGVar14 + p->nObjs <= pGVar3)) goto LAB_007b13ba;
                    Vec_IntPush(vWin,(int)((ulong)((long)pGVar3 - (long)pGVar14) >> 2) * -0x55555555
                               );
                    pGVar14 = p->pObjs;
                    if ((pGVar3 < pGVar14) || (pGVar14 + p->nObjs <= pGVar3)) goto LAB_007b13ba;
                    iVar10 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,
                                            (int)((ulong)((long)pGVar3 - (long)pGVar14) >> 2) *
                                            -0x55555555);
                    Vec_IntPushUniqueOrder(p_00,iVar10);
                    pGVar14 = p->pObjs;
                  }
                }
              }
            }
            if (pGVar1 < pGVar14) {
LAB_007b13ba:
              __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                            ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
            }
          } while( true );
        }
        goto LAB_007b132c;
      }
      goto LAB_007b1334;
    }
  }
LAB_007b1352:
  qsort(vWin->pArray,(long)vWin->nSize,4,Vec_IntSortCompare1);
  if (p_00->pArray != (int *)0x0) {
    free(p_00->pArray);
  }
  free(p_00);
  return;
LAB_007b1317:
  lVar17 = lVar17 + 1;
  if (pVVar12[lVar15].nSize <= lVar17) goto LAB_007b132c;
  goto LAB_007b0fa9;
LAB_007b132c:
  iVar18 = p_00->nSize;
LAB_007b1334:
  pVVar12[lVar15].nSize = 0;
  lVar16 = lVar16 + 1;
  if (iVar18 <= lVar16) goto LAB_007b1352;
  goto LAB_007b0f5f;
}

Assistant:

void Gia_WinCreateFromCut( Gia_Man_t * p, Vec_Int_t * vIn, Vec_Wec_t * vLevels, Vec_Int_t * vWin )
{
    Vec_Int_t * vLevel; 
    Gia_Obj_t * pObj, * pFanout;
    int k, i, f, iObj, Level;
    Vec_Int_t * vUsed = Vec_IntAlloc( 100 );
    // precondition:  the levelized structure is empty
    assert( Vec_WecSizeSize(vLevels) == 0 );
    // clean the resulting array
    Vec_IntClear( vWin );
    // start a new trav ID and add nodes to the levelized structure
    Gia_ManIncrementTravId( p );
    Vec_IntForEachEntry( vIn, iObj, i )
    {
        Gia_ObjSetTravIdCurrentId( p, iObj );
        Vec_WecPush( vLevels, Gia_ObjLevelId(p, iObj), iObj );
        Vec_IntPush( vWin, iObj );
        Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevelId(p, iObj) );
    }
    // iterate through all objects and explore their fanouts
    //Vec_WecForEachLevel( vLevels, vLevel, k )
    Vec_IntForEachEntry( vUsed, Level, k )
    {
        vLevel = Vec_WecEntry( vLevels, Level );
        Gia_ManForEachObjVec( vLevel, p, pObj, i )
            Gia_ObjForEachFanoutStatic( p, pObj, pFanout, f )
            {
                if ( f == 5 ) // explore first 5 fanouts of the node
                    break;
                if ( Gia_ObjIsAnd(pFanout) && // internal node
                    !Gia_ObjIsTravIdCurrent(p, pFanout) && // not in the window
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin0(pFanout)) && // but fanins are
                     Gia_ObjIsTravIdCurrent(p, Gia_ObjFanin1(pFanout)) )  // in the window
                {
                    // add fanout to the window and to the levelized structure
                    Gia_ObjSetTravIdCurrent( p, pFanout );
                    Vec_WecPush( vLevels, Gia_ObjLevel(p, pFanout), Gia_ObjId(p, pFanout) );
                    Vec_IntPush( vWin, Gia_ObjId(p, pFanout) );
                    Vec_IntPushUniqueOrder( vUsed, Gia_ObjLevel(p, pFanout) );
                }
            }
        Vec_IntClear( vLevel );
    }
    Vec_IntSort( vWin, 0 );
    Vec_IntFree( vUsed );
}